

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O2

u32 irr::PixelCombine32(u32 c2,u32 c1)

{
  u32 uVar1;
  int iVar2;
  
  uVar1 = c2;
  if ((0xffffff < c1) && (uVar1 = c1, c1 < 0xff000000)) {
    iVar2 = (c1 >> 0x18) - ((int)c1 >> 0x1f);
    uVar1 = (c1 & 0xff000000) + (c2 >> 8 & 0xff0000) * (0x100 - iVar2) & 0xff000000 |
            (((c1 & 0xff00ff) - (c2 & 0xff00ff)) * iVar2 >> 8) + (c2 & 0xff00ff) & 0xff00ff |
            (((c1 & 0xff00) - (c2 & 0xff00)) * iVar2 >> 8) + (c2 & 0xff00) & 0xff00;
  }
  return uVar1;
}

Assistant:

inline u32 PixelCombine32(const u32 c2, const u32 c1)
{
	// alpha test
	u32 alpha = c1 & 0xFF000000;

	if (0 == alpha)
		return c2;
	if (0xFF000000 == alpha) {
		return c1;
	}

	alpha >>= 24;

	// add highbit alpha, if ( alpha > 127 ) alpha += 1;
	// stretches [0;255] to [0;256] to avoid division by 255. use division 256 == shr 8
	alpha += (alpha >> 7);

	u32 srcRB = c1 & 0x00FF00FF;
	u32 srcXG = c1 & 0x0000FF00;

	u32 dstRB = c2 & 0x00FF00FF;
	u32 dstXG = c2 & 0x0000FF00;

	u32 rb = srcRB - dstRB;
	u32 xg = srcXG - dstXG;

	rb *= alpha;
	xg *= alpha;
	rb >>= 8;
	xg >>= 8;

	rb += dstRB;
	xg += dstXG;

	rb &= 0x00FF00FF;
	xg &= 0x0000FF00;

	u32 sa = c1 >> 24;
	u32 da = c2 >> 24;
	u32 blendAlpha_fix8 = (sa * 256 + da * (256 - alpha)) >> 8;
	return blendAlpha_fix8 << 24 | rb | xg;
}